

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixot.cpp
# Opt level: O1

void * TPZStructMatrixOT<double>::ThreadData::ThreadWork(void *datavoid)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int *piVar4;
  TPZCompMesh *mesh;
  TPZCompEl *pTVar5;
  bool bVar6;
  int iVar7;
  TPZCompEl **ppTVar8;
  long *plVar9;
  long lVar10;
  long lVar11;
  TPZFMatrix<double> *rhs;
  long lVar12;
  long lVar13;
  unique_lock<std::mutex> lock;
  TPZAutoPointer<TPZGuiInterface> guiInterface;
  TPZElementMatrixT<double> ek;
  TPZElementMatrixT<double> ef;
  long local_8728;
  unique_lock<std::mutex> local_8718;
  unique_lock *local_8708;
  mutex_type *local_8700;
  TPZAutoPointer<TPZGuiInterface> local_86f8;
  TPZFMatrix<double> *local_86f0;
  TPZFMatrix<double> *local_86e8;
  TPZFMatrix<double> *local_86e0;
  TPZFNMatrix<1000,_double> *local_86d8;
  TPZFNMatrix<1000,_double> *local_86d0;
  long local_86c8;
  TPZChunkVector<TPZCompEl_*,_10> *local_86c0;
  long local_86b8;
  TPZElementMatrixT<double> local_86b0;
  TPZElementMatrixT<double> local_4370;
  
  lVar3 = *(long *)((long)datavoid + 0x30);
  local_86c8 = *(long *)((long)datavoid + 0x98);
  piVar4 = *(int **)((long)datavoid + 0x90);
  mesh = *(TPZCompMesh **)(*datavoid + 8);
  local_86f8.fRef = *(TPZReference **)((long)datavoid + 8);
  LOCK();
  ((local_86f8.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_86f8.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  TPZElementMatrixT<double>::TPZElementMatrixT(&local_86b0,mesh,EK);
  TPZElementMatrixT<double>::TPZElementMatrixT(&local_4370,mesh,EF);
  plVar9 = *(long **)((long)datavoid + 0x20);
  local_86b8 = *(long *)(*(long *)((long)datavoid + 0xa0) + 0x10);
  LOCK();
  local_8728 = *plVar9;
  *plVar9 = *plVar9 + 1;
  UNLOCK();
  local_86c0 = &(mesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>;
  lVar1 = local_86b8 + -1;
  local_8700 = (mutex_type *)((long)datavoid + 0x38);
  local_8708 = (unique_lock *)((long)datavoid + 0x60);
  local_86d0 = &local_86b0.fMat;
  local_86e0 = &local_4370.fMat.super_TPZFMatrix<double>;
  local_86d8 = &local_86b0.fConstrMat;
  local_86e8 = &local_4370.fConstrMat.super_TPZFMatrix<double>;
  do {
    if (local_86b8 <= local_8728) break;
    lVar10 = *(long *)(*(long *)(*(long *)((long)datavoid + 0xa0) + 8) + local_8728 * 8);
    if (lVar10 < 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"the element in ElColorSequence is negative???\n",0x2e);
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/pzstrmatrixot.cpp"
                 ,0x3a7);
    }
    ppTVar8 = TPZChunkVector<TPZCompEl_*,_10>::operator[](local_86c0,lVar10);
    pTVar5 = *ppTVar8;
    (**(code **)(*(long *)pTVar5 + 0x108))(pTVar5,&local_86b0,&local_4370);
    if (((local_86f8.fRef == (TPZReference *)0x0) ||
        ((local_86f8.fRef)->fPointer == (TPZGuiInterface *)0x0)) ||
       (bVar6 = TPZGuiInterface::AmIKilled((local_86f8.fRef)->fPointer), !bVar6)) {
      iVar7 = (**(code **)(*(long *)pTVar5 + 0x1f0))(pTVar5);
      if (iVar7 == 0) {
        TPZElementMatrix::ComputeDestinationIndices(&local_86b0.super_TPZElementMatrix);
      }
      else {
        TPZElementMatrixT<double>::ApplyConstraints(&local_86b0);
        TPZElementMatrixT<double>::ApplyConstraints(&local_4370);
        TPZElementMatrix::ComputeDestinationIndices(&local_86b0.super_TPZElementMatrix);
      }
      TPZEquationFilter::Filter
                ((TPZEquationFilter *)(*datavoid + 0x48),
                 &local_86b0.super_TPZElementMatrix.fSourceIndex.super_TPZVec<long>,
                 &local_86b0.super_TPZElementMatrix.fDestinationIndex.super_TPZVec<long>);
      lVar10 = **(long **)((long)datavoid + 0xa8);
      lVar11 = lVar1;
      if (lVar1 < lVar10) {
        lVar11 = lVar10;
      }
      do {
        lVar12 = lVar10;
        lVar13 = lVar11;
        if (lVar1 <= lVar12) break;
        lVar10 = lVar12 + 1;
        lVar13 = lVar12;
      } while (*(long *)(*(long *)(lVar3 + 8) + 8 + lVar12 * 8) == 1);
      lVar10 = *(long *)(*(long *)(local_86c8 + 8) + local_8728 * 8);
      while (lVar13 < lVar10) {
        local_8718._M_device = local_8700;
        local_8718._M_owns = false;
        std::unique_lock<std::mutex>::lock(&local_8718);
        local_8718._M_owns = true;
        *piVar4 = 1;
        std::condition_variable::wait(local_8708);
        lVar13 = **(long **)((long)datavoid + 0xa8) + -1;
        do {
          lVar11 = lVar13 * 8;
          lVar13 = lVar13 + 1;
        } while (*(long *)(*(long *)(lVar3 + 8) + 0x10 + lVar11) == 1);
        std::unique_lock<std::mutex>::~unique_lock(&local_8718);
      }
      if (*(long *)((long)datavoid + 0x10) == 0) {
        plVar9 = (long *)0x0;
      }
      else {
        plVar9 = (long *)__dynamic_cast(*(long *)((long)datavoid + 0x10),&TPZBaseMatrix::typeinfo,
                                        &TPZMatrix<double>::typeinfo,0);
      }
      if (*(long *)((long)datavoid + 0x18) == 0) {
        local_86f0 = (TPZFMatrix<double> *)0x0;
      }
      else {
        local_86f0 = (TPZFMatrix<double> *)
                     __dynamic_cast(*(long *)((long)datavoid + 0x18),&TPZBaseMatrix::typeinfo,
                                    &TPZFMatrix<double>::typeinfo,0);
      }
      if (plVar9 != (long *)0x0) {
        bVar6 = TPZElementMatrix::HasDependency(&local_86b0.super_TPZElementMatrix);
        if (bVar6) {
          (**(code **)(*plVar9 + 0x1a0))
                    (plVar9,local_86d8,&local_86b0.super_TPZElementMatrix.fSourceIndex,
                     &local_86b0.super_TPZElementMatrix.fDestinationIndex);
          rhs = local_86e8;
          if (*(char *)((long)datavoid + 0xb0) == '\x01') {
LAB_013649f0:
            TPZFMatrix<double>::AddFel
                      (local_86f0,rhs,
                       &local_86b0.super_TPZElementMatrix.fSourceIndex.super_TPZVec<long>,
                       &local_86b0.super_TPZElementMatrix.fDestinationIndex.super_TPZVec<long>);
          }
        }
        else {
          (**(code **)(*plVar9 + 0x1a0))
                    (plVar9,local_86d0,&local_86b0.super_TPZElementMatrix.fSourceIndex,
                     &local_86b0.super_TPZElementMatrix.fDestinationIndex);
          rhs = local_86e0;
          if (*(char *)((long)datavoid + 0xb0) != '\0') goto LAB_013649f0;
        }
      }
      lVar10 = lVar1;
      if (lVar1 < lVar13) {
        lVar10 = lVar13;
      }
      do {
        lVar11 = lVar10;
        if (lVar1 <= lVar13) break;
        lVar12 = lVar13 * 8;
        lVar11 = lVar13;
        lVar13 = lVar13 + 1;
      } while (*(long *)(*(long *)(lVar3 + 8) + 8 + lVar12) == 1);
      lVar11 = (ulong)(lVar11 == local_8728 + -1) + lVar11;
      lVar10 = lVar1;
      if (lVar1 < lVar11) {
        lVar10 = lVar11;
      }
      do {
        lVar13 = lVar10;
        if (lVar1 <= lVar11) break;
        lVar12 = lVar11 * 8;
        lVar13 = lVar11;
        lVar11 = lVar11 + 1;
      } while (*(long *)(*(long *)(lVar3 + 8) + 8 + lVar12) == 1);
      if (**(long **)((long)datavoid + 0xa8) < lVar13) {
        **(long **)((long)datavoid + 0xa8) = lVar13;
      }
      *(undefined8 *)(*(long *)(lVar3 + 8) + local_8728 * 8) = 1;
      iVar7 = 0;
      bVar6 = true;
      if (*piVar4 != 0) {
        local_8718._M_device = local_8700;
        local_8718._M_owns = false;
        std::unique_lock<std::mutex>::lock(&local_8718);
        local_8718._M_owns = true;
        *piVar4 = 0;
        std::condition_variable::notify_all();
        std::unique_lock<std::mutex>::~unique_lock(&local_8718);
      }
    }
    else {
      iVar7 = 3;
      bVar6 = false;
    }
    if (bVar6) {
      plVar9 = *(long **)((long)datavoid + 0x20);
      LOCK();
      local_8728 = *plVar9;
      *plVar9 = *plVar9 + 1;
      UNLOCK();
      iVar7 = 0;
    }
  } while (iVar7 == 0);
  local_8718._M_device = local_8700;
  local_8718._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_8718);
  local_8718._M_owns = true;
  lVar10 = **(long **)((long)datavoid + 0xa8);
  lVar11 = lVar10;
  lVar13 = lVar1;
  if (lVar1 < lVar10) {
    lVar13 = lVar10;
  }
  do {
    lVar12 = lVar13;
    if (lVar1 <= lVar11) break;
    lVar2 = lVar11 * 8;
    lVar12 = lVar11;
    lVar11 = lVar11 + 1;
  } while (*(long *)(*(long *)(lVar3 + 8) + 8 + lVar2) == 1);
  lVar12 = (ulong)(lVar12 == local_8728 + -1) + lVar12;
  if (lVar10 < lVar12) {
    **(long **)((long)datavoid + 0xa8) = lVar12;
  }
  std::condition_variable::notify_all();
  *piVar4 = 0;
  std::unique_lock<std::mutex>::~unique_lock(&local_8718);
  local_4370.super_TPZElementMatrix._vptr_TPZElementMatrix =
       (_func_int **)&PTR__TPZElementMatrixT_0194d7b0;
  TPZBlock::~TPZBlock(&local_4370.fConstrBlock);
  TPZFMatrix<double>::~TPZFMatrix(&local_4370.fConstrMat.super_TPZFMatrix<double>,&PTR_PTR_01884558)
  ;
  TPZBlock::~TPZBlock(&local_4370.fBlock);
  TPZFMatrix<double>::~TPZFMatrix(&local_4370.fMat.super_TPZFMatrix<double>,&PTR_PTR_01884558);
  TPZElementMatrix::~TPZElementMatrix(&local_4370.super_TPZElementMatrix);
  local_86b0.super_TPZElementMatrix._vptr_TPZElementMatrix =
       (_func_int **)&PTR__TPZElementMatrixT_0194d7b0;
  TPZBlock::~TPZBlock(&local_86b0.fConstrBlock);
  TPZFMatrix<double>::~TPZFMatrix(&local_86b0.fConstrMat.super_TPZFMatrix<double>,&PTR_PTR_01884558)
  ;
  TPZBlock::~TPZBlock(&local_86b0.fBlock);
  TPZFMatrix<double>::~TPZFMatrix(&local_86b0.fMat.super_TPZFMatrix<double>,&PTR_PTR_01884558);
  TPZElementMatrix::~TPZElementMatrix(&local_86b0.super_TPZElementMatrix);
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&local_86f8);
  return (void *)0x0;
}

Assistant:

void *TPZStructMatrixOT<TVar>::ThreadData::ThreadWork(void *datavoid)
{
    ThreadData *data = (ThreadData *) datavoid;
//    TPZStructMatrixOT *strmat = data->fStruct;
    TPZVec<int64_t> &ComputedElements = *(data->fComputedElements);
    TPZVec<int64_t> &ElBlocked = *(data->fElBlocked);

    int &SomeoneIsSleeping = *(data->fSomeoneIsSleeping);
    
    TPZCompMesh *cmesh = data->fStruct->Mesh();
    TPZAutoPointer<TPZGuiInterface> guiInterface = data->fGuiInterface;
    TPZElementMatrixT<TVar> ek(cmesh,TPZElementMatrix::EK);
    TPZElementMatrixT<TVar> ef(cmesh,TPZElementMatrix::EF);
    int64_t numelements = data->fElSequenceColor->size();
    int64_t index = data->fCurrentIndex->fetch_add(1);
#ifdef PZ_LOG
    if (logger.isDebugEnabled()) {
        std::stringstream sout;
        sout << "ThreadData starting with " << data->fThreadSeqNum << " total elements " << numelements << std::endl;
        sout << "index = " << index << std::endl;
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    
#ifdef HUGEDEBUG
    data->fMutexAccessElement.lock();
    std::cout << "ThreadData starting with " << data->fThreadSeqNum << " total elements " << numelements << std::endl;
    std::cout << "index = " << index << std::endl;
    std::cout.flush();
    data->fMutexAccessElement.unlock();
#endif
    
    while (index < numelements)
    {
        
        int64_t iel = data->fElSequenceColor->operator[](index);
#ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            std::stringstream sout;
            sout << "Computing element " << index;
            LOGPZ_DEBUG(logger, sout.str())
        }
#endif
#ifdef PZ_LOG
        std::stringstream sout;
        sout << "Element " << index << " elapsed time ";
        TPZTimer timeforel(sout.str());
        timeforel.start();
#endif

        if (iel >= 0){
            TPZCompEl *el = cmesh->ElementVec()[iel];
#ifndef DRY_RUN
            el->CalcStiff(ek,ef);
#else
            TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *>(el);
            intel->InitializeElementMatrix(ek,ef);
#endif

            if(guiInterface) if(guiInterface->AmIKilled()){
                break;
            }
            
#ifndef DRY_RUN
            if(!el->HasDependency()) {
                
                ek.ComputeDestinationIndices();
                data->fStruct->FilterEquations(ek.fSourceIndex,ek.fDestinationIndex);
                
#ifdef PZ_LOG
                if(loggerel.isDebugEnabled())
                {
                    std::stringstream sout;
                    ek.fMat.Print("Element stiffness matrix",sout);
                    ef.fMat.Print("Element right hand side", sout);
                    LOGPZ_DEBUG(loggerel,sout.str())
                }
#endif
            } else {
                // the element has dependent nodes
                ek.ApplyConstraints();
                ef.ApplyConstraints();
                ek.ComputeDestinationIndices();
                data->fStruct->FilterEquations(ek.fSourceIndex,ek.fDestinationIndex);
            }
#endif
            
#ifdef PZ_LOG
            timeforel.stop();
            if (logger.isDebugEnabled())
            {
                std::stringstream sout;
                sout << timeforel.processName() <<  timeforel;
                LOGPZ_DEBUG(logger, sout.str())
            }
#endif

            int64_t localcompleted = *(data->fElementCompleted);
            bool localupdated = false;
            while (localcompleted < numelements-1 && ComputedElements[localcompleted+1] == 1) {
                localcompleted++;
                localupdated = true;
            }
            int64_t needscomputed = ElBlocked[index];
#ifdef PZ_LOG
            if (logger.isDebugEnabled())
            {
                std::stringstream sout;
                if (localupdated) {
                    sout << "Localcompleted updated without thread lock\n";
                }
                
                sout << "Element " << index << " is computed and can assemble if required " << needscomputed << " is smaller than localcompleted " << localcompleted;
                LOGPZ_DEBUG(logger, sout.str())
            }
#endif
            
#ifdef HUGEDEBUG
            data->fMutexAccessElement.lock();
            std::cout << "threadEK " << data->fThreadSeqNum << " index " << index << " localcompleted " << localcompleted << " needscomputed " << needscomputed << std::endl;
            data->fMutexAccessElement.unlock();
#endif
            
            bool hadtowait = false;
            while (needscomputed > localcompleted) {
                // block the thread till the element needed has been assembled
              std::unique_lock<std::mutex> lock(data->fMutexAccessElement);
                SomeoneIsSleeping = 1;
                hadtowait = true;
#ifdef HUGEDEBUG
                std::cout << "threadEK " <<data->fThreadSeqNum << " Index " << index << " going to sleep waiting for " << needscomputed << std::endl;
                std::cout.flush();
#endif
#ifdef PZ_LOG
                if (logger.isDebugEnabled())
                {
                    std::stringstream sout;
                    sout << "Element " << index << " cannot be assembled - going to sleep";
                    LOGPZ_DEBUG(logger, sout.str())
                }
#endif
                data->fConditionVar.wait(lock);
                
                localcompleted = *data->fElementCompleted;
                localupdated = false;
                while (ComputedElements[localcompleted+1] == 1) {
                    localcompleted++;
                    localupdated = true;
                }
#ifdef PZ_LOG
                if (logger.isDebugEnabled())
                {
                    std::stringstream sout;
                    sout << "thread wakeup for element index " << index << std::endl;
                    if (localupdated) {
                        sout << "Localcompleted updated without thread lock\n";
                    }
                    
                    sout << "Element " << index << " is computed and can assemble if required " << needscomputed << " is smaller than localcompleted " << localcompleted;
                    LOGPZ_DEBUG(logger, sout.str())
                }
#endif
            }
            
#ifdef HUGEDEBUG
            if (hadtowait) {
              std::scoped_lock lock(data->fMutexAccessElement);
                std::cout << "threadEK " <<data->fThreadSeqNum << " Index " << index << " continuing\n";
            }
#endif
            
#ifndef DRY_RUN
            auto globMatrix =
                    dynamic_cast<TPZMatrix<TVar> *>(data->fGlobMatrix);
                auto globRhs =
                    dynamic_cast<TPZFMatrix<TVar> *>(data->fGlobRhs);
            if(globMatrix){
                // Assemble the matrix
                if(!ek.HasDependency())
                {
                    globMatrix->AddKel(ek.fMat,ek.fSourceIndex,ek.fDestinationIndex);
                    if(data->fComputeRhs) globRhs->AddFel(ef.fMat,ek.fSourceIndex,ek.fDestinationIndex);
                }
                else
                {
                    globMatrix->AddKel(ek.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
                    if(data->fComputeRhs)globRhs->AddFel(ef.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
                }
                
            }
#endif
            
            localupdated = false;
            while (localcompleted < numelements-1 && ComputedElements[localcompleted+1] == 1) {
                localcompleted++;
                localupdated = true;
            }
            if (localcompleted == index-1) {
                localcompleted++;
            }
            while (localcompleted < numelements-1 && ComputedElements[localcompleted+1] == 1) {
                localcompleted++;
                localupdated = true;
            }
            bool elementcompletedupdate = false;
            if (*data->fElementCompleted < localcompleted) {
//                std::cout << "Updating element completed " << localcompleted << std::endl;
                *data->fElementCompleted = localcompleted;
                elementcompletedupdate = true;
            }
#ifdef PZ_LOG
            if (logger.isDebugEnabled())
            {
                std::stringstream sout;
                sout << "Element " << index << " has been assembled ";
                if (localupdated) {
                    sout << "\nLocalcompleted updated without thread lock\n";
                }
                if (elementcompletedupdate) {
                    sout << "\nfElementCompleted updated to localcompleted\n";
                }
                sout << "local completed " << localcompleted;
                LOGPZ_DEBUG(logger, sout.str())
            }
#endif
            ComputedElements[index] = 1;
            if (SomeoneIsSleeping) {
              std::unique_lock<std::mutex> lock(data->fMutexAccessElement);
#ifdef HUGEDEBUG
                std::cout << "threadEK " <<data->fThreadSeqNum <<  " Computed index " << index << " Waking up ElementsCompleted " << *data->fElementCompleted << std::endl;
                std::cout.flush();
#endif
                
#ifdef PZ_LOG
                if (logger.isDebugEnabled())
                {
                    LOGPZ_DEBUG(logger, "condition broadcast")
                }
#endif
                SomeoneIsSleeping = 0;
                data->fConditionVar.notify_all();
            }

        }
        else
        {
            std::cout << "the element in ElColorSequence is negative???\n";
            DebugStop();
        }
        index = data->fCurrentIndex->fetch_add(1);
        
    }
    // just make sure threads that were accidentally blocked get woken up
    std::unique_lock<std::mutex> lock(data->fMutexAccessElement);
    bool localupdated = false;
    int64_t localcompleted = *(data->fElementCompleted);
    while (localcompleted < numelements-1 && ComputedElements[localcompleted+1] == 1) {
        localcompleted++;
        localupdated = true;
    }
    if (localcompleted == index-1) {
        localcompleted++;
    }
    bool elementcompletedupdate = false;
    if (*data->fElementCompleted < localcompleted) {
        //                std::cout << "Updating element completed " << localcompleted << std::endl;
        *data->fElementCompleted = localcompleted;
        elementcompletedupdate = true;
    }

#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        LOGPZ_DEBUG(logger, "Finishing up")
        if (localupdated) {
            LOGPZ_DEBUG(logger, "updated localcompleted")
        }
        if (elementcompletedupdate) {
            LOGPZ_DEBUG(logger, "updated fElementCompleted")
        }
        if (localupdated || elementcompletedupdate) {
            std::stringstream sout;
            sout << "localcompleted " << localcompleted;
            LOGPZ_DEBUG(logger, sout.str())
        }
        LOGPZ_DEBUG(logger, "finishing and condition broadcast")
    }
#endif
    data->fConditionVar.notify_all();
    SomeoneIsSleeping = 0;
    return 0;
}